

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

int pem_write_SSL_SESSION_i2d(void *x,uchar **outp)

{
  ulong __n;
  int iVar1;
  int iVar2;
  int iStack_20;
  undefined4 uStack_1c;
  uint8_t *puStack_18;
  
  iVar1 = SSL_SESSION_to_bytes((SSL_SESSION *)x,&puStack_18,(size_t *)&iStack_20);
  iVar2 = -1;
  if (iVar1 != 0) {
    __n = CONCAT44(uStack_1c,iStack_20);
    if ((__n & 0xffffffff80000000) == 0) {
      if (outp != (uchar **)0x0) {
        if (__n != 0) {
          memcpy(*outp,puStack_18,__n);
        }
        *outp = *outp + CONCAT44(uStack_1c,iStack_20);
      }
      OPENSSL_free(puStack_18);
      iVar2 = iStack_20;
    }
    else {
      OPENSSL_free(puStack_18);
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                    ,0x300);
    }
  }
  return iVar2;
}

Assistant:

SSL_SESSION *d2i_SSL_SESSION(SSL_SESSION **a, const uint8_t **pp, long length) {
  if (length < 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *pp, length);

  UniquePtr<SSL_SESSION> ret = SSL_SESSION_parse(&cbs, &ssl_crypto_x509_method,
                                                 NULL /* no buffer pool */);
  if (!ret) {
    return NULL;
  }

  if (a) {
    SSL_SESSION_free(*a);
    *a = ret.get();
  }
  *pp = CBS_data(&cbs);
  return ret.release();
}